

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplicialCholesky.h
# Opt level: O0

void __thiscall
Eigen::
SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,0,int>,1,Eigen::AMDOrdering<int>>>
::_solve_impl<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
          (SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
           *this,MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *b,
          MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *dest)

{
  Index IVar1;
  Index IVar2;
  SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
  *in_RDI;
  Product<Eigen::PermutationMatrix<_1,__1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2> PVar3;
  PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *permutation;
  undefined1 in_stack_ffffffffffffff60 [16];
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffff70;
  DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  *in_stack_ffffffffffffff78;
  DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> in_stack_ffffffffffffff88;
  
  if (in_RDI->m_info == Success) {
    IVar1 = PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::size
                      ((PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)0x1e9706);
    if (IVar1 < 1) {
      MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator=
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff60._8_8_);
    }
    else {
      Eigen::operator*(in_stack_ffffffffffffff60._0_8_,
                       (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_RDI);
      MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator=
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff60._8_8_);
    }
    IVar1 = SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>::nonZeros
                      ((SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_> *)
                       in_stack_ffffffffffffff88.m_diagonal);
    if (0 < IVar1) {
      SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
      ::derived(in_RDI);
      SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>::matrixL
                ((SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_> *
                 )0x1e9784);
      TriangularViewImpl<Eigen::SparseMatrix<double,0,int>const,5u,Eigen::Sparse>::
      solveInPlace<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((TriangularViewImpl<const_Eigen::SparseMatrix<double,_0,_int>,_5U,_Eigen::Sparse> *
                 )in_stack_ffffffffffffff70,in_stack_ffffffffffffff60._8_8_);
    }
    IVar2 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                      (in_stack_ffffffffffffff60._0_8_);
    if (0 < IVar2) {
      in_stack_ffffffffffffff88 =
           MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::asDiagonal
                     ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_RDI);
      DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>::inverse
                ((DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)in_stack_ffffffffffffff78);
      DiagonalBase<Eigen::DiagonalWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
      ::operator*(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator=
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff60._8_8_);
    }
    IVar1 = SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>::nonZeros
                      ((SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_> *)
                       in_stack_ffffffffffffff88.m_diagonal);
    permutation = in_stack_ffffffffffffff60._0_8_;
    if (0 < IVar1) {
      SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
      ::derived(in_RDI);
      SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>::matrixU
                (in_stack_ffffffffffffff60._0_8_);
      permutation = in_stack_ffffffffffffff60._0_8_;
      TriangularViewImpl<Eigen::Transpose<Eigen::SparseMatrix<double,0,int>const>const,6u,Eigen::Sparse>
      ::solveInPlace<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((TriangularViewImpl<const_Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>,_6U,_Eigen::Sparse>
                  *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff60._8_8_);
    }
    IVar1 = PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::size
                      ((PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)0x1e9847);
    if (0 < IVar1) {
      PVar3 = Eigen::operator*(permutation,
                               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_RDI);
      MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator=
                (in_stack_ffffffffffffff70,
                 (DenseBase<Eigen::Product<Eigen::PermutationMatrix<_1,__1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2>_>
                  *)PVar3.m_rhs);
    }
  }
  return;
}

Assistant:

void _solve_impl(const MatrixBase<Rhs> &b, MatrixBase<Dest> &dest) const
    {
      eigen_assert(m_factorizationIsOk && "The decomposition is not in a valid state for solving, you must first call either compute() or symbolic()/numeric()");
      eigen_assert(m_matrix.rows()==b.rows());

      if(m_info!=Success)
        return;

      if(m_P.size()>0)
        dest = m_P * b;
      else
        dest = b;

      if(m_matrix.nonZeros()>0) // otherwise L==I
        derived().matrixL().solveInPlace(dest);

      if(m_diag.size()>0)
        dest = m_diag.asDiagonal().inverse() * dest;

      if (m_matrix.nonZeros()>0) // otherwise U==I
        derived().matrixU().solveInPlace(dest);

      if(m_P.size()>0)
        dest = m_Pinv * dest;
    }